

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<std::complex<float>_>::SolveJacobi
          (TPZMatrix<std::complex<float>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<float>_> *F,TPZFMatrix<std::complex<float>_> *result,
          TPZFMatrix<std::complex<float>_> *residual,TPZFMatrix<std::complex<float>_> *scratch,
          REAL *tol,int FromCurrent)

{
  long lVar1;
  int64_t iVar2;
  complex<float> *__x;
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  long *in_RSI;
  complex<float> *in_RDI;
  TPZFMatrix<std::complex<float>_> *in_R8;
  TPZFMatrix<std::complex<float>_> *in_R9;
  float fVar3;
  int64_t row;
  double *in_stack_00000008;
  int in_stack_00000010;
  int64_t i;
  int64_t ic;
  int64_t it;
  int64_t c;
  int64_t r;
  REAL res;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar4;
  complex<float> *in_stack_ffffffffffffff90;
  int64_t in_stack_ffffffffffffff98;
  TPZFMatrix<std::complex<float>_> *this_00;
  long local_58;
  long local_50;
  double local_38;
  
  if (in_stack_00000010 == 0) {
    TPZFMatrix<std::complex<float>_>::operator=(in_R8,in_R9);
    (**(code **)(*in_RCX + 0x78))();
  }
  else {
    (**(code **)(in_RDI->_M_value + 0x140))(in_RDI,in_RCX,in_RDX,in_R9);
  }
  fVar3 = ::Norm((TPZFMatrix<std::complex<float>_> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  local_38 = TPZExtractVal::val(fVar3);
  lVar1 = (**(code **)(in_RDI->_M_value + 0x60))();
  iVar2 = TPZBaseMatrix::Cols(in_RDX);
  local_50 = 0;
  while( true ) {
    uVar4 = false;
    if (local_50 < *in_RSI) {
      uVar4 = *in_stack_00000008 <= ABS(local_38) && ABS(local_38) != *in_stack_00000008;
    }
    if ((bool)uVar4 == false) break;
    for (local_58 = 0; local_58 < iVar2; local_58 = local_58 + 1) {
      for (this_00 = (TPZFMatrix<std::complex<float>_> *)0x0; (long)this_00 < lVar1;
          this_00 = (TPZFMatrix<std::complex<float>_> *)
                    ((long)&(this_00->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                            super_TPZSavable._vptr_TPZSavable + 1)) {
        __x = TPZFMatrix<std::complex<float>_>::operator()
                        (this_00,in_stack_ffffffffffffff98,(int64_t)in_stack_ffffffffffffff90);
        in_stack_ffffffffffffff90 =
             (complex<float> *)(**(code **)(in_RDI->_M_value + 0x120))(in_RDI,this_00);
        std::operator/(__x,(complex<float> *)0x12a9f8d);
        in_stack_ffffffffffffff98 = row;
        TPZFMatrix<std::complex<float>_>::operator()(this_00,row,(int64_t)in_stack_ffffffffffffff90)
        ;
        std::complex<float>::operator+=(in_stack_ffffffffffffff90,in_RDI);
      }
    }
    (**(code **)(in_RDI->_M_value + 0x140))(in_RDI,in_RCX,in_RDX,in_R9);
    fVar3 = ::Norm((TPZFMatrix<std::complex<float>_> *)CONCAT17(uVar4,in_stack_ffffffffffffff80));
    local_38 = TPZExtractVal::val(fVar3);
    local_50 = local_50 + 1;
  }
  if (in_R8 != (TPZFMatrix<std::complex<float>_> *)0x0) {
    TPZFMatrix<std::complex<float>_>::operator=(in_R8,in_R9);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveJacobi(int64_t &numiterations,const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
								  TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch, REAL &tol,const int FromCurrent) {
	
	
	if(FromCurrent) {
		Residual(result,F,scratch);
	} else {
		scratch = F;
		result.Zero();
	}
	REAL res;
	res = TPZExtractVal::val(Norm(scratch));
	int64_t r = Dim();
	int64_t c = F.Cols();
	for(int64_t it=0; it<numiterations && (fabs(res)) > tol; it++) {
		for(int64_t ic=0; ic<c; ic++) {
			for(int64_t i=0; i<r; i++) {
				result(i,ic) += (scratch)(i,ic)/GetVal(i,i);
			}
		}
		Residual(result,F,scratch);
		res = TPZExtractVal::val(Norm(scratch));
	}
	if(residual) *residual = scratch;
}